

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O1

bool __thiscall anon_unknown.dwarf_38a::NinjaMain::EnsureBuildDirExists(NinjaMain *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  int *piVar6;
  char *pcVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"builddir","");
  BindingEnv::LookupVariable(&local_70,&(this->state_).bindings_,&local_50);
  this_00 = &this->build_dir_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  sVar3 = (this->build_dir_)._M_string_length;
  bVar8 = true;
  if ((sVar3 != 0) && (this->config_->dry_run == false)) {
    pcVar4 = (this_00->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar4,pcVar4 + sVar3);
    std::__cxx11::string::append((char *)&local_70);
    bVar5 = DiskInterface::MakeDirs(&(this->disk_interface_).super_DiskInterface,&local_70);
    if (bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 != 0x11) {
        pcVar4 = (this_00->_M_dataplus)._M_p;
        pcVar7 = strerror(*piVar6);
        bVar8 = false;
        Error("creating build directory %s: %s",pcVar4,pcVar7);
      }
    }
  }
  return bVar8;
}

Assistant:

bool NinjaMain::EnsureBuildDirExists() {
  build_dir_ = state_.bindings_.LookupVariable("builddir");
  if (!build_dir_.empty() && !config_.dry_run) {
    if (!disk_interface_.MakeDirs(build_dir_ + "/.") && errno != EEXIST) {
      Error("creating build directory %s: %s",
            build_dir_.c_str(), strerror(errno));
      return false;
    }
  }
  return true;
}